

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O3

Index __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_argmax_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  float fVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  char *__function;
  ulong uVar10;
  float fVar11;
  
  uVar9 = this->_Np;
  if (((long)uVar9 < 0) ||
     (uVar2 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows, (long)uVar2 <= (long)uVar9)) {
LAB_0017258e:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<long, -1, 1>, Level = 0]"
    ;
  }
  else {
    plVar3 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar4 = plVar3[uVar9];
    if ((-1 < lVar4) &&
       (uVar5 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
       lVar4 < (long)uVar5)) {
      uVar6 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      uVar10 = uVar9 + 1;
      if ((long)uVar10 < (long)uVar6) {
        pfVar7 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
        ;
        fVar11 = pfVar7[lVar4];
        do {
          if (uVar2 <= uVar10) goto LAB_0017258e;
          uVar8 = plVar3[uVar10];
          if (((long)uVar8 < 0) || (uVar5 <= uVar8)) goto LAB_001725a5;
          fVar1 = pfVar7[uVar8];
          uVar8 = uVar10;
          if (fVar1 <= fVar11) {
            fVar1 = fVar11;
            uVar8 = uVar9;
          }
          uVar9 = uVar8;
          fVar11 = fVar1;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      return uVar9;
    }
LAB_001725a5:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
    ;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xb5,__function);
}

Assistant:

Index _argmax_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Index m_idx = _Np; Scalar m = v(idxs(m_idx));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx); m_idx = i; }
    }
    return m_idx;
  }